

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O0

void __thiscall CEObserver::~CEObserver(CEObserver *this)

{
  CEObserver *in_RDI;
  
  ~CEObserver(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

CEObserver::~CEObserver(void)
{
    free_members();
}